

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O3

void update_mv_component_stats(int comp,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  aom_cdf_prob (*paaVar8) [5];
  uint uVar9;
  int iVar10;
  uint uVar11;
  aom_cdf_prob *paVar12;
  int iVar13;
  ulong uVar14;
  
  iVar10 = -comp;
  if (0 < comp) {
    iVar10 = comp;
  }
  uVar9 = iVar10 - 1;
  uVar4 = 0x1f;
  if ((int)uVar9 >> 3 != 0) {
    for (; (uint)((int)uVar9 >> 3) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  if (uVar9 < 8) {
    uVar4 = 0;
  }
  bVar7 = (byte)uVar4;
  iVar13 = -8 << (bVar7 & 0x1f);
  if (bVar7 == 0) {
    iVar13 = 0;
  }
  uVar1 = mvcomp->sign_cdf[2];
  bVar6 = (char)(uVar1 >> 4) + 4;
  uVar2 = mvcomp->sign_cdf[0];
  if (comp < 0) {
    sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar6 & 0x1f));
  }
  else {
    sVar3 = -(uVar2 >> (bVar6 & 0x1f));
  }
  uVar11 = iVar10 + iVar13 + -1 >> 3;
  mvcomp->sign_cdf[0] = uVar2 + sVar3;
  mvcomp->sign_cdf[2] = uVar1 + (uVar1 < 0x20);
  uVar1 = mvcomp->classes_cdf[0xb];
  bVar6 = (char)(uVar1 >> 4) + 5;
  uVar14 = 0;
  do {
    uVar2 = mvcomp->classes_cdf[uVar14];
    if (uVar14 < (uVar4 & 0xff)) {
      sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar6 & 0x1f));
    }
    else {
      sVar3 = -(uVar2 >> (bVar6 & 0x1f));
    }
    mvcomp->classes_cdf[uVar14] = sVar3 + uVar2;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 10);
  mvcomp->classes_cdf[0xb] = mvcomp->classes_cdf[0xb] + (ushort)(uVar1 < 0x20);
  if (bVar7 == 0) {
    uVar1 = mvcomp->class0_cdf[2];
    bVar6 = (char)(uVar1 >> 4) + 4;
    uVar2 = mvcomp->class0_cdf[0];
    if ((char)uVar11 < '\x01') {
      sVar3 = -(uVar2 >> (bVar6 & 0x1f));
    }
    else {
      sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar6 & 0x1f));
    }
    mvcomp->class0_cdf[0] = sVar3 + uVar2;
    mvcomp->class0_cdf[2] = uVar1 + (uVar1 < 0x20);
  }
  else {
    paVar12 = mvcomp->bits_cdf[0] + 2;
    uVar14 = 0;
    do {
      uVar1 = *paVar12;
      bVar6 = (char)(uVar1 >> 4) + 4;
      uVar2 = (*(aom_cdf_prob (*) [3])(paVar12 + -2))[0];
      if ((uVar11 >> ((uint)uVar14 & 0x1f) & 1) == 0) {
        sVar3 = -(uVar2 >> (bVar6 & 0x1f));
      }
      else {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar6 & 0x1f));
      }
      (*(aom_cdf_prob (*) [3])(paVar12 + -2))[0] = sVar3 + uVar2;
      *paVar12 = uVar1 + (uVar1 < 0x20);
      uVar14 = uVar14 + 1;
      paVar12 = paVar12 + 3;
    } while ((uVar4 & 0xff) != uVar14);
  }
  if (-1 < precision) {
    paaVar8 = mvcomp->class0_fp_cdf + (int)uVar11;
    if (bVar7 != 0) {
      paaVar8 = &mvcomp->fp_cdf;
    }
    uVar1 = (*paaVar8)[4];
    bVar6 = (char)(uVar1 >> 4) + 5;
    uVar14 = 0;
    do {
      uVar2 = (*paaVar8)[uVar14];
      if (uVar14 < (uVar9 >> 1 & 3)) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar6 & 0x1f));
      }
      else {
        sVar3 = -(uVar2 >> (bVar6 & 0x1f));
      }
      (*paaVar8)[uVar14] = sVar3 + uVar2;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 3);
    (*paaVar8)[4] = (*paaVar8)[4] + (ushort)(uVar1 < 0x20);
    if (precision != '\0') {
      lVar5 = 0x42;
      if (bVar7 == 0) {
        lVar5 = 0x3c;
      }
      uVar1 = *(ushort *)((long)mvcomp->classes_cdf + lVar5 + 4);
      bVar7 = (char)(uVar1 >> 4) + 4;
      uVar2 = *(ushort *)((long)mvcomp->classes_cdf + lVar5);
      if ((uVar9 & 1) == 0) {
        sVar3 = -(uVar2 >> (bVar7 & 0x1f));
      }
      else {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar7 & 0x1f));
      }
      *(ushort *)((long)mvcomp->classes_cdf + lVar5) = uVar2 + sVar3;
      *(ushort *)((long)mvcomp->classes_cdf + lVar5 + 4) = uVar1 + (uVar1 < 0x20);
    }
  }
  return;
}

Assistant:

static void update_mv_component_stats(int comp, nmv_component *mvcomp,
                                      MvSubpelPrecision precision) {
  assert(comp != 0);
  int offset;
  const int sign = comp < 0;
  const int mag = sign ? -comp : comp;
  const int mv_class = av1_get_mv_class(mag - 1, &offset);
  const int d = offset >> 3;         // int mv data
  const int fr = (offset >> 1) & 3;  // fractional mv data
  const int hp = offset & 1;         // high precision mv data

  // Sign
  update_cdf(mvcomp->sign_cdf, sign, 2);

  // Class
  update_cdf(mvcomp->classes_cdf, mv_class, MV_CLASSES);

  // Integer bits
  if (mv_class == MV_CLASS_0) {
    update_cdf(mvcomp->class0_cdf, d, CLASS0_SIZE);
  } else {
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    for (int i = 0; i < n; ++i)
      update_cdf(mvcomp->bits_cdf[i], (d >> i) & 1, 2);
  }
  // Fractional bits
  if (precision > MV_SUBPEL_NONE) {
    aom_cdf_prob *fp_cdf =
        mv_class == MV_CLASS_0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf;
    update_cdf(fp_cdf, fr, MV_FP_SIZE);
  }

  // High precision bit
  if (precision > MV_SUBPEL_LOW_PRECISION) {
    aom_cdf_prob *hp_cdf =
        mv_class == MV_CLASS_0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf;
    update_cdf(hp_cdf, hp, 2);
  }
}